

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_NormalIterators_Test<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_NormalIterators_Test<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  sparse_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  char *in_RDI;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  iterator it;
  AssertionResult gtest_ar_;
  iterator *in_stack_fffffffffffffcf8;
  sparse_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffffd00;
  string local_2e8 [4];
  int in_stack_fffffffffffffd1c;
  char *in_stack_fffffffffffffd20;
  Type in_stack_fffffffffffffd2c;
  AssertHelper *in_stack_fffffffffffffd30;
  char *in_stack_fffffffffffffd60;
  char *in_stack_fffffffffffffd68;
  char *in_stack_fffffffffffffd70;
  AssertionResult *in_stack_fffffffffffffd78;
  AssertHelper *in_stack_fffffffffffffd80;
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffda0;
  string local_250 [135];
  undefined1 local_1c9;
  value_type *in_stack_fffffffffffffe38;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffe40;
  undefined1 local_110 [247];
  undefined1 local_19;
  AssertionResult local_18;
  
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffffda0);
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_fffffffffffffda0);
  local_19 = google::
             sparse_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
             ::operator==(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffffd00,(bool *)in_stack_fffffffffffffcf8,
             (type *)0xa614aa);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
               in_stack_fffffffffffffd60);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c,in_stack_fffffffffffffd20,
               in_stack_fffffffffffffd1c,in_RDI);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffd80,(Message *)in_stack_fffffffffffffd78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd00);
    std::__cxx11::string::~string((string *)(local_110 + 0x10));
    testing::Message::~Message((Message *)0xa6156b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xa61602);
  this_00 = (sparse_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
             *)(in_RDI + 0x10);
  HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                  *)local_110,(int)((ulong)this_00 >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            *)in_stack_fffffffffffffe40._M_head_impl,in_stack_fffffffffffffe38);
  std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xa61650);
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffffda0);
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_fffffffffffffda0);
  local_1c9 = google::
              sparse_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=(this_00,in_stack_fffffffffffffcf8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,(bool *)in_stack_fffffffffffffcf8,(type *)0xa616b3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffe38);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
               in_stack_fffffffffffffd60);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c,in_stack_fffffffffffffd20,
               in_stack_fffffffffffffd1c,in_RDI);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffd80,(Message *)in_stack_fffffffffffffd78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string(local_250);
    testing::Message::~Message((Message *)0xa617ac);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xa61840);
  google::
  sparse_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::operator++(this_00);
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_fffffffffffffda0);
  google::
  sparse_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::operator==(this_00,in_stack_fffffffffffffcf8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,(bool *)in_stack_fffffffffffffcf8,(type *)0xa61894);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffda0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
               in_stack_fffffffffffffd60);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c,in_stack_fffffffffffffd20,
               in_stack_fffffffffffffd1c,in_RDI);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffd80,(Message *)in_stack_fffffffffffffd78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string(local_2e8);
    testing::Message::~Message((Message *)0xa6194c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xa619d1);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, NormalIterators) {
  EXPECT_TRUE(this->ht_.begin() == this->ht_.end());
  this->ht_.insert(this->UniqueObject(1));
  {
    typename TypeParam::iterator it = this->ht_.begin();
    EXPECT_TRUE(it != this->ht_.end());
    ++it;
    EXPECT_TRUE(it == this->ht_.end());
  }
}